

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  string out;
  string in;
  string mode;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Tc;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  G;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  string local_718;
  string local_6f8;
  string local_6d8;
  string ext;
  string name;
  int aiStack_498 [290];
  
  if (argc - 5U < 0xfffffffe) goto LAB_0010c71a;
  std::__cxx11::string::string((string *)&mode,argv[1],(allocator *)&name);
  std::__cxx11::string::string((string *)&in,argv[2],(allocator *)&name);
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  if (argc == 4) {
    std::__cxx11::string::string((string *)&name,argv[3],(allocator *)&ext);
    std::__cxx11::string::operator=((string *)&out,(string *)&name);
LAB_0010c458:
    std::__cxx11::string::~string((string *)&name);
LAB_0010c45d:
    std::ifstream::ifstream(&name,(string *)&in,_S_in);
    iVar1 = *(int *)((long)aiStack_498 + *(long *)(name._M_dataplus._M_p + -0x18));
    std::ifstream::~ifstream(&name);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)&mode);
      if (iVar1 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Compressing file ");
        poVar3 = std::operator<<(poVar3,(string *)&in);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"Output will be saved to file ");
        poVar3 = std::operator<<(poVar3,(string *)&out);
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::string((string *)&local_6d8,(string *)&in);
        compute_repair(&local_6d8);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::string((string *)&local_6f8,(string *)&out);
        packed_gamma_file3<unsigned_int,_6UL>::packed_gamma_file3
                  ((packed_gamma_file3<unsigned_int,_6UL> *)&name,&local_6f8,true);
        std::__cxx11::string::~string((string *)&local_6f8);
        packed_gamma_file3<unsigned_int,_6UL>::compress_and_store
                  ((packed_gamma_file3<unsigned_int,_6UL> *)&name,&::A,&::G,&T_vec);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Decompressing archive ");
        poVar3 = std::operator<<(poVar3,(string *)&in);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"Output will be saved to ");
        poVar3 = std::operator<<(poVar3,(string *)&out);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::string((string *)&local_718,(string *)&in);
        packed_gamma_file3<unsigned_int,_6UL>::packed_gamma_file3
                  ((packed_gamma_file3<unsigned_int,_6UL> *)&name,&local_718,false);
        std::__cxx11::string::~string((string *)&local_718);
        A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        G.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Tc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        G.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        G.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Tc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        Tc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        packed_gamma_file3<unsigned_int,_6UL>::read_and_decompress
                  ((packed_gamma_file3<unsigned_int,_6UL> *)&name,&A,&G,&Tc);
        std::ofstream::ofstream(&ext,(string *)&out,_S_out);
        decompress(&A,&G,&Tc,(ofstream *)&ext);
        std::ofstream::close();
        poVar3 = std::operator<<((ostream *)&std::cout,"done.");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::ofstream::~ofstream(&ext);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&Tc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::
        _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~_Vector_base(&G.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       );
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      packed_gamma_file3<unsigned_int,_6UL>::~packed_gamma_file3
                ((packed_gamma_file3<unsigned_int,_6UL> *)&name);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&in);
      std::__cxx11::string::~string((string *)&mode);
      return 0;
    }
  }
  else {
    std::__cxx11::string::string((string *)&name,argv[2],(allocator *)&ext);
    std::__cxx11::string::operator=((string *)&out,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
    iVar1 = std::__cxx11::string::compare((char *)&mode);
    if (iVar1 == 0) {
      std::__cxx11::string::append((char *)&out);
      goto LAB_0010c45d;
    }
    iVar1 = std::__cxx11::string::compare((char *)&mode);
    if (iVar1 == 0) {
      lVar2 = std::__cxx11::string::find_last_of((char *)&out,0x1143ea);
      if (lVar2 != -1) {
        std::__cxx11::string::substr((ulong)&name,(ulong)&out);
        std::__cxx11::string::substr((ulong)&ext,(ulong)&out);
        iVar1 = std::__cxx11::string::compare((char *)&ext);
        if (iVar1 == 0) {
          std::__cxx11::string::_M_assign((string *)&out);
        }
        else {
          std::__cxx11::string::append((char *)&out);
        }
        std::__cxx11::string::~string((string *)&ext);
        goto LAB_0010c458;
      }
      goto LAB_0010c45d;
    }
  }
  help();
LAB_0010c71a:
  help();
  std::__cxx11::string::~string((string *)&ext);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&in);
  std::__cxx11::string::~string((string *)&mode);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc,char** argv) {

	if(argc!=3 and argc != 4) help();

	string mode(argv[1]);

	string in(argv[2]);
	string out;

	if(argc == 4){

		//use output name provided by user
		out = string(argv[3]);

	}else{

		out = string(argv[2]);

		if(mode.compare("c")==0){

			//if compress mode, append .rp
			out.append(".rp");

		}else if(mode.compare("d")==0){


			//if decompress mode, extract extension (if any)
			size_t dot = out.find_last_of(".");
			if (dot != std::string::npos){

				string name = out.substr(0, dot);
				string ext  = out.substr(dot, out.size() - dot);

				//if extension = .rp, remove it. Otherwise, add extension .decompressed
				if(ext.compare(".rp") == 0){

					out = name;

				}else{

					out.append(".decompressed");

				}

			}

		}else{

			help();

		}

	}

	if(not ifstream(in).good()) help();


	if(mode.compare("c")==0){

		cout << "Compressing file " << in << endl;
		cout << "Output will be saved to file " << out << endl<<endl;

		compute_repair(in);

		packed_gamma_file3<> out_file(out);
		//compress the grammar with Elias' gamma-encoding and store it to file
		out_file.compress_and_store(A,G,T_vec);

	}else{

		cout << "Decompressing archive " << in << endl;
		cout << "Output will be saved to " << out << endl;

		auto pgf = packed_gamma_file3<>(in, false);

		vector<itype> A;
		vector<pair<itype,itype> > G;
		vector<itype> Tc;

		//read and decompress grammar (the DAG)
		pgf.read_and_decompress(A,G,Tc);

		ofstream ofs(out);

		//expand the grammar to file
		decompress(A,G,Tc,ofs);

		ofs.close();

		cout << "done." << endl;

	}

}